

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner_t.hpp
# Opt level: O1

void __thiscall
deci_scanner_t::deci_scanner_t(deci_scanner_t *this,istream *input,string *fname,bool interactive)

{
  pointer pcVar1;
  counter_type cVar2;
  
  deci_FlexLexer::deci_FlexLexer(&this->super_deci_FlexLexer,input,(ostream *)0x0);
  (this->super_deci_FlexLexer).super_FlexLexer._vptr_FlexLexer =
       (_func_int **)&PTR__deci_scanner_t_0011e328;
  (this->fname)._M_dataplus._M_p = (pointer)&(this->fname).field_2;
  pcVar1 = (fname->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->fname,pcVar1,pcVar1 + fname->_M_string_length);
  (this->cloc).begin.line = 1;
  (this->cloc).begin.column = 1;
  this->interactive = interactive;
  (this->cloc).begin.filename = &this->fname;
  (this->cloc).end.filename = (this->cloc).begin.filename;
  cVar2 = (this->cloc).begin.column;
  (this->cloc).end.line = (this->cloc).begin.line;
  (this->cloc).end.column = cVar2;
  return;
}

Assistant:

deci_scanner_t(std::istream& input, const std::string& fname, bool interactive)
    :deci_FlexLexer(&input),fname(fname),cloc(),interactive(interactive) 
  {
    this->cloc.initialize(&this->fname, 1, 1);
  }